

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O0

int unicode_case1(CharRange *cr,int case_mask)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint in_ESI;
  uint32_t idx;
  uint32_t i;
  uint32_t len;
  uint32_t type;
  uint32_t code;
  uint32_t v;
  uint32_t mask;
  uint32_t tab_run_mask [3];
  CharRange *in_stack_ffffffffffffffb8;
  uint local_3c;
  uint local_38;
  uint local_24;
  uint local_20 [8];
  
  local_20[0] = 0x2bf5;
  local_20[1] = 0x147a;
  local_20[2] = 0x5fc;
  if (in_ESI != 0) {
    local_24 = 0;
    for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
      if (((int)in_ESI >> ((byte)local_38 & 0x1f) & 1U) != 0) {
        local_24 = local_20[local_38] | local_24;
      }
    }
    local_20[3] = in_ESI;
    for (local_3c = 0; local_3c < 0x169; local_3c = local_3c + 1) {
      uVar1 = case_conv_table1[local_3c];
      uVar2 = uVar1 >> 4 & 0xf;
      if ((local_24 >> (sbyte)uVar2 & 1) != 0) {
        if (uVar2 == 4) {
          if (((local_20[3] & 1) != 0) && ((local_20[3] & 6) != 0)) goto LAB_001d11c7;
          for (local_38 = 0; local_38 < (uVar1 >> 8 & 0x7f); local_38 = local_38 + 2) {
            iVar3 = cr_add_interval(in_stack_ffffffffffffffb8,0,0x1d10ef);
            if (iVar3 != 0) {
              return -1;
            }
          }
        }
        else if ((uVar2 == 5) && (((local_20[3] & 1) == 0 || ((local_20[3] & 6) == 0)))) {
          if (((local_20[3] & 1) == 0) &&
             (iVar3 = cr_add_interval(in_stack_ffffffffffffffb8,0,0x1d1153), iVar3 != 0)) {
            return -1;
          }
          iVar3 = cr_add_interval(in_stack_ffffffffffffffb8,0,0x1d117f);
          if (iVar3 != 0) {
            return -1;
          }
          if (((local_20[3] & 1) != 0) &&
             (iVar3 = cr_add_interval(in_stack_ffffffffffffffb8,0,0x1d11b2), iVar3 != 0)) {
            return -1;
          }
        }
        else {
LAB_001d11c7:
          iVar3 = cr_add_interval(in_stack_ffffffffffffffb8,0,0x1d11dd);
          if (iVar3 != 0) {
            return -1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int unicode_case1(CharRange *cr, int case_mask)
{
#define MR(x) (1 << RUN_TYPE_ ## x)
    const uint32_t tab_run_mask[3] = {
        MR(U) | MR(UF) | MR(UL) | MR(LSU) | MR(U2L_399_EXT2) | MR(UF_D20) |
        MR(UF_D1_EXT) | MR(U_EXT) | MR(U_EXT2) | MR(U_EXT3),

        MR(L) | MR(LF) | MR(UL) | MR(LSU) | MR(U2L_399_EXT2) | MR(LF_EXT) | MR(L_EXT2),

        MR(UF) | MR(LF) | MR(UL) | MR(LSU) | MR(U2L_399_EXT2) | MR(LF_EXT) | MR(UF_D20) | MR(UF_D1_EXT) | MR(LF_EXT),
    };
#undef MR
    uint32_t mask, v, code, type, len, i, idx;

    if (case_mask == 0)
        return 0;
    mask = 0;
    for(i = 0; i < 3; i++) {
        if ((case_mask >> i) & 1)
            mask |= tab_run_mask[i];
    }
    for(idx = 0; idx < countof(case_conv_table1); idx++) {
        v = case_conv_table1[idx];
        type = (v >> (32 - 17 - 7 - 4)) & 0xf;
        code = v >> (32 - 17);
        len = (v >> (32 - 17 - 7)) & 0x7f;
        if ((mask >> type) & 1) {
            //            printf("%d: type=%d %04x %04x\n", idx, type, code, code + len - 1);
            switch(type) {
            case RUN_TYPE_UL:
                if ((case_mask & CASE_U) && (case_mask & (CASE_L | CASE_F)))
                    goto def_case;
                code += ((case_mask & CASE_U) != 0);
                for(i = 0; i < len; i += 2) {
                    if (cr_add_interval(cr, code + i, code + i + 1))
                        return -1;
                }
                break;
            case RUN_TYPE_LSU:
                if ((case_mask & CASE_U) && (case_mask & (CASE_L | CASE_F)))
                    goto def_case;
                if (!(case_mask & CASE_U)) {
                    if (cr_add_interval(cr, code, code + 1))
                        return -1;
                }
                if (cr_add_interval(cr, code + 1, code + 2))
                    return -1;
                if (case_mask & CASE_U) {
                    if (cr_add_interval(cr, code + 2, code + 3))
                        return -1;
                }
                break;
            default:
            def_case:
                if (cr_add_interval(cr, code, code + len))
                    return -1;
                break;
            }
        }
    }
    return 0;
}